

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heuristics.cpp
# Opt level: O0

void __thiscall
Clasp::ClaspVsids_t<Clasp::DomScore>::updateReason
          (ClaspVsids_t<Clasp::DomScore> *this,Solver *s,LitVec *lits,Literal r)

{
  bool bVar1;
  size_type sVar2;
  Var VVar3;
  const_reference this_00;
  pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *in_RDX;
  Solver *in_RSI;
  ClaspVsids_t<Clasp::DomScore> *in_RDI;
  size_type end;
  size_type i;
  bool ms;
  Solver *in_stack_ffffffffffffffb8;
  size_type in_stack_ffffffffffffffd8;
  uint in_stack_ffffffffffffffdc;
  Var v;
  Solver *s_00;
  ClaspVsids_t<Clasp::DomScore> *this_01;
  Literal local_4;
  
  this_01 = in_RDI;
  if (1 < in_RDI->scType_) {
    in_stack_ffffffffffffffdc = CONCAT13(in_RDI->scType_ == 3,(int3)in_stack_ffffffffffffffdc);
    in_stack_ffffffffffffffd8 = 0;
    sVar2 = bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::size(in_RDX);
    for (; in_stack_ffffffffffffffd8 != sVar2;
        in_stack_ffffffffffffffd8 = in_stack_ffffffffffffffd8 + 1) {
      if ((in_stack_ffffffffffffffdc & 0x1000000) == 0) {
        s_00 = in_RSI;
        bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::operator[]
                  (in_RDX,in_stack_ffffffffffffffd8);
        bVar1 = Solver::seen(in_stack_ffffffffffffffb8,(Literal)(uint32)((ulong)in_RSI >> 0x20));
        in_RSI = s_00;
        if (!bVar1) goto LAB_0023b398;
      }
      else {
LAB_0023b398:
        in_stack_ffffffffffffffb8 = in_RSI;
        s_00 = in_stack_ffffffffffffffb8;
        this_00 = bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::operator[]
                            (in_RDX,in_stack_ffffffffffffffd8);
        Literal::var(this_00);
        updateVarActivity(this_01,s_00,(Var)((ulong)in_RDX >> 0x20),
                          (double)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
      }
      in_RSI = s_00;
    }
  }
  v = (Var)((ulong)in_RDX >> 0x20);
  if (((in_RDI->scType_ & 1) != 0) && (VVar3 = Literal::var(&local_4), VVar3 != 0)) {
    Literal::var(&local_4);
    updateVarActivity(this_01,in_RSI,v,
                      (double)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  }
  return;
}

Assistant:

void ClaspVsids_t<ScoreType>::updateReason(const Solver& s, const LitVec& lits, Literal r) {
	if (scType_ > HeuParams::score_min) {
		const bool ms = scType_ == HeuParams::score_multi_set;
		for (LitVec::size_type i = 0, end = lits.size(); i != end; ++i) {
			if (ms || !s.seen(lits[i])) { updateVarActivity(s, lits[i].var()); }
		}
	}
	if ((scType_ & 1u) != 0 && r.var() != 0) { updateVarActivity(s, r.var()); }
}